

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhinull.cpp
# Opt level: O3

bool __thiscall QNullRenderBuffer::create(QNullRenderBuffer *this)

{
  long in_FS_OFFSET;
  QRhiResource *copy;
  bool local_19;
  QNullRenderBuffer *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->valid == true) {
    (*(this->super_QRhiRenderBuffer).super_QRhiResource._vptr_QRhiResource[3])(this);
  }
  this->valid = true;
  this->generation = this->generation + 1;
  local_19 = true;
  local_18 = this;
  QHash<QRhiResource*,bool>::emplace<bool_const&>
            ((QHash<QRhiResource*,bool> *)
             &((this->super_QRhiRenderBuffer).super_QRhiResource.m_rhi)->resources,
             (QRhiResource **)&local_18,&local_19);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool QNullRenderBuffer::create()
{
    if (valid)
        destroy();

    valid = true;
    generation += 1;

    QRHI_RES_RHI(QRhiNull);
    rhiD->registerResource(this);

    return true;
}